

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiMesh *pMesh)

{
  _Bit_type **pp_Var1;
  float fVar2;
  uint uVar3;
  aiBone *paVar4;
  aiBone **ppaVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ValidateDSProcess *afSum;
  uint **ppuVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  aiFace *paVar13;
  char *pcVar14;
  uint *puVar15;
  ValidateDSProcess *pVVar16;
  char *name;
  vector<bool,_std::allocator<bool>_> abRefList;
  ValidateDSProcess local_70;
  undefined8 local_50;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  uVar10 = this->mScene->mNumMaterials;
  puVar15 = (uint *)this;
  if ((uVar10 == 0) || (uVar3 = pMesh->mMaterialIndex, uVar3 < uVar10)) {
    Validate(this,&pMesh->mName);
    uVar10 = pMesh->mNumFaces;
    if (uVar10 != 0) {
      uVar3 = pMesh->mPrimitiveTypes;
      ppuVar9 = &pMesh->mFaces->mIndices;
      uVar6 = 0;
      puVar15 = &switchD_003a5f09::switchdataD_0071e580;
      do {
        if (uVar3 != 0) {
          switch(((aiFace *)(ppuVar9 + -1))->mNumIndices) {
          case 0:
            pcVar14 = "aiMesh::mFaces[%i].mNumIndices is 0";
            goto LAB_003a6317;
          case 1:
            if ((uVar3 & 1) == 0) {
              pcVar14 = 
              "aiMesh::mFaces[%i] is a POINT but aiMesh::mPrimitiveTypes does not report the POINT flag"
              ;
              goto LAB_003a6317;
            }
            break;
          case 2:
            if ((uVar3 & 2) == 0) {
              pcVar14 = 
              "aiMesh::mFaces[%i] is a LINE but aiMesh::mPrimitiveTypes does not report the LINE flag"
              ;
              goto LAB_003a6317;
            }
            break;
          case 3:
            if ((uVar3 & 4) == 0) {
              pcVar14 = 
              "aiMesh::mFaces[%i] is a TRIANGLE but aiMesh::mPrimitiveTypes does not report the TRIANGLE flag"
              ;
              goto LAB_003a6317;
            }
            break;
          default:
            if ((uVar3 & 8) == 0) {
              pcVar14 = 
              "aiMesh::mFaces[%i] is a POLYGON but aiMesh::mPrimitiveTypes does not report the POLYGON flag"
              ;
              goto LAB_003a6317;
            }
          }
        }
        if (*ppuVar9 == (uint *)0x0) {
          pcVar14 = "aiMesh::mFaces[%i].mIndices is NULL";
LAB_003a6317:
          ReportError((ValidateDSProcess *)&switchD_003a5f09::switchdataD_0071e580,pcVar14,
                      (ulong)uVar6);
        }
        uVar6 = uVar6 + 1;
        ppuVar9 = ppuVar9 + 2;
      } while (uVar10 != uVar6);
    }
    uVar3 = pMesh->mNumVertices;
    if (((ulong)uVar3 == 0) ||
       ((pMesh->mVertices == (aiVector3D *)0x0 && (this->mScene->mFlags == 0)))) {
      pcVar14 = "The mesh %s contains no vertices";
LAB_003a63cb:
      ReportError((ValidateDSProcess *)puVar15,pcVar14,(pMesh->mName).data);
    }
    if ((int)uVar3 < 0) {
      pcVar14 = "Mesh has too many vertices: %u, but the limit is %u";
    }
    else {
      if (-1 < (int)uVar10) {
        if ((pMesh->mBitangents == (aiVector3D *)0x0) == (pMesh->mTangents != (aiVector3D *)0x0)) {
          ReportError((ValidateDSProcess *)puVar15,
                      "If there are tangents, bitangent vectors must be present as well");
        }
        if ((uVar10 != 0) && ((pMesh->mFaces != (aiFace *)0x0 || (this->mScene->mFlags != 0)))) {
          pVVar16 = &local_70;
          local_70.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
          local_70.super_BaseProcess.shared._0_4_ = 0;
          local_70.super_BaseProcess.progress = (ProgressHandler *)0x0;
          local_70.mScene._0_4_ = 0;
          local_50 = 0;
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)pVVar16,(ulong)uVar3,false);
          if (pMesh->mNumFaces != 0) {
            uVar11 = 0;
            do {
              uVar10 = pMesh->mFaces[uVar11].mNumIndices;
              if (0x7fff < uVar10) {
                ReportError(pVVar16,"Face %u has too many faces: %u, but the limit is %u",uVar11,
                            (ulong)uVar10,0x7fff);
              }
              paVar13 = pMesh->mFaces + uVar11;
              if (paVar13->mNumIndices != 0) {
                uVar8 = 0;
                do {
                  uVar10 = paVar13->mIndices[uVar8];
                  if (pMesh->mNumVertices <= uVar10) {
                    ReportError(pVVar16,"aiMesh::mFaces[%i]::mIndices[%i] is out of range",uVar11,
                                uVar8 & 0xffffffff);
                  }
                  pp_Var1 = &(((_Bvector_base<std::allocator<bool>_> *)
                              local_70.super_BaseProcess._vptr_BaseProcess)->_M_impl).
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                            (uVar10 >> 6);
                  *pp_Var1 = (_Bit_type *)((ulong)*pp_Var1 | 1L << ((byte)uVar10 & 0x3f));
                  uVar8 = uVar8 + 1;
                  pVVar16 = (ValidateDSProcess *)local_70.super_BaseProcess._vptr_BaseProcess;
                } while ((uint)uVar8 < paVar13->mNumIndices);
              }
              uVar10 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar10;
            } while (uVar10 < pMesh->mNumFaces);
          }
          if ((ulong)pMesh->mNumVertices == 0) {
            local_70.super_BaseProcess.progress =
                 (ProgressHandler *)local_70.super_BaseProcess._vptr_BaseProcess;
            local_70.mScene._0_4_ = 0;
          }
          else {
            uVar11 = 0;
            pVVar16 = (ValidateDSProcess *)0x1;
            bVar12 = false;
            do {
              if (((ulong)(&(((_Bvector_base<std::allocator<bool>_> *)
                             local_70.super_BaseProcess._vptr_BaseProcess)->_M_impl).
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                          [uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
                bVar12 = true;
              }
              uVar11 = uVar11 + 1;
            } while (pMesh->mNumVertices != uVar11);
            local_70.super_BaseProcess.progress =
                 (ProgressHandler *)local_70.super_BaseProcess._vptr_BaseProcess;
            local_70.mScene._0_4_ = 0;
            if (bVar12) {
              ReportWarning((ValidateDSProcess *)0x1,"There are unreferenced vertices");
            }
          }
          uVar11 = 0;
          do {
            if ((pMesh->mTextureCoords[uVar11] == (aiVector3D *)0x0) || (pMesh->mNumVertices == 0))
            goto LAB_003a60c3;
            uVar11 = uVar11 + 1;
          } while (uVar11 != 8);
          uVar11 = 8;
LAB_003a60c3:
          if ((uint)uVar11 < 8) {
            uVar11 = uVar11 & 0xffffffff;
            do {
              if ((pMesh->mTextureCoords[uVar11] != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)
                 ) {
                ReportError(pVVar16,
                            "Texture coordinate channel %i exists although the previous channel was NULL."
                           );
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 != 8);
          }
          uVar11 = 0;
          do {
            if ((pMesh->mColors[uVar11] == (aiColor4D *)0x0) || (pMesh->mNumVertices == 0))
            goto LAB_003a6105;
            uVar11 = uVar11 + 1;
          } while (uVar11 != 8);
          uVar11 = 8;
LAB_003a6105:
          if ((uint)uVar11 < 8) {
            uVar11 = uVar11 & 0xffffffff;
            do {
              if ((pMesh->mColors[uVar11] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
                ReportError(pVVar16,
                            "Vertex color channel %i is exists although the previous channel was NULL."
                           );
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 != 8);
          }
          if (pMesh->mNumBones == 0) {
            if (pMesh->mBones != (aiBone **)0x0) {
              ReportError(pVVar16,"aiMesh::mBones is non-null although there are no bones");
            }
          }
          else {
            if (pMesh->mBones == (aiBone **)0x0) {
              ReportError(pVVar16,"aiMesh::mBones is NULL (aiMesh::mNumBones is %i)");
            }
            if ((ulong)pMesh->mNumVertices == 0) {
              afSum = (ValidateDSProcess *)0x0;
              pVVar16 = (ValidateDSProcess *)0x0;
            }
            else {
              pVVar16 = (ValidateDSProcess *)((ulong)pMesh->mNumVertices << 2);
              afSum = (ValidateDSProcess *)operator_new__((ulong)pVVar16);
              if ((ulong)pMesh->mNumVertices != 0) {
                pVVar16 = afSum;
                memset(afSum,0,(ulong)pMesh->mNumVertices << 2);
              }
            }
            if (pMesh->mNumBones != 0) {
              local_38 = 1;
              uVar10 = 0;
              do {
                uVar11 = (ulong)uVar10;
                paVar4 = pMesh->mBones[uVar11];
                if ((int)paVar4->mNumWeights < 0) {
                  ReportError(pVVar16,"Bone %u has too many weights: %u, but the limit is %u",uVar11
                              ,(ulong)paVar4->mNumWeights,0x7fffffff);
                }
                if (paVar4 == (aiBone *)0x0) {
                  ReportError(pVVar16,"aiMesh::mBones[%i] is NULL (aiMesh::mNumBones is %i)",uVar11)
                  ;
                }
                Validate(pVVar16,pMesh,paVar4,(float *)afSum);
                local_44 = uVar10 + 1;
                uVar10 = pMesh->mNumBones;
                local_40 = uVar11;
                if (local_44 < uVar10) {
                  ppaVar5 = pMesh->mBones;
                  paVar4 = ppaVar5[uVar11];
                  uVar3 = (paVar4->mName).length;
                  pcVar14 = (paVar4->mName).data;
                  uVar11 = local_38;
                  do {
                    paVar4 = ppaVar5[uVar11];
                    if ((uVar3 == (paVar4->mName).length) &&
                       (pVVar16 = (ValidateDSProcess *)pcVar14,
                       iVar7 = bcmp(pcVar14,(paVar4->mName).data,(ulong)uVar3), iVar7 == 0)) {
                      ReportError(pVVar16,
                                  "aiMesh::mBones[%i], name = \"%s\" has the same name as aiMesh::mBones[%i]"
                                  ,local_40,pcVar14,uVar11 & 0xffffffff);
                    }
                    uVar11 = uVar11 + 1;
                  } while (uVar10 != (uint)uVar11);
                }
                local_38 = local_38 + 1;
                uVar10 = local_44;
              } while (local_44 < pMesh->mNumBones);
            }
            if (pMesh->mNumVertices != 0) {
              uVar11 = 0;
              do {
                fVar2 = *(float *)((long)&(afSum->super_BaseProcess)._vptr_BaseProcess + uVar11 * 4)
                ;
                if (((fVar2 != 0.0) || (NAN(fVar2))) && ((fVar2 <= 0.94 || (1.05 <= fVar2)))) {
                  ReportWarning(pVVar16,"aiMesh::mVertices[%i]: bone weight sum != 1.0 (sum is %f)",
                                uVar11 & 0xffffffff);
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 < pMesh->mNumVertices);
            }
            if (afSum != (ValidateDSProcess *)0x0) {
              operator_delete__(afSum);
            }
          }
          if ((ValidateDSProcess *)local_70.super_BaseProcess._vptr_BaseProcess !=
              (ValidateDSProcess *)0x0) {
            operator_delete(local_70.super_BaseProcess._vptr_BaseProcess);
          }
          return;
        }
        pcVar14 = "Mesh %s contains no faces";
        goto LAB_003a63cb;
      }
      pcVar14 = "Mesh has too many faces: %u, but the limit is %u";
      uVar3 = uVar10;
    }
    uVar11 = 0x7fffffff;
  }
  else {
    uVar11 = (ulong)(uVar10 - 1);
    pcVar14 = "aiMesh::mMaterialIndex is invalid (value: %i maximum: %i)";
  }
  ReportError((ValidateDSProcess *)puVar15,pcVar14,(ulong)uVar3,uVar11);
}

Assistant:

void ValidateDSProcess::Validate( const aiMesh* pMesh)
{
    // validate the material index of the mesh
    if (mScene->mNumMaterials && pMesh->mMaterialIndex >= mScene->mNumMaterials)
    {
        ReportError("aiMesh::mMaterialIndex is invalid (value: %i maximum: %i)",
            pMesh->mMaterialIndex,mScene->mNumMaterials-1);
    }

    Validate(&pMesh->mName);

    for (unsigned int i = 0; i < pMesh->mNumFaces; ++i)
    {
        aiFace& face = pMesh->mFaces[i];

        if (pMesh->mPrimitiveTypes)
        {
            switch (face.mNumIndices)
            {
            case 0:
                ReportError("aiMesh::mFaces[%i].mNumIndices is 0",i);
                break;
            case 1:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_POINT))
                {
                    ReportError("aiMesh::mFaces[%i] is a POINT but aiMesh::mPrimitiveTypes "
                        "does not report the POINT flag",i);
                }
                break;
            case 2:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_LINE))
                {
                    ReportError("aiMesh::mFaces[%i] is a LINE but aiMesh::mPrimitiveTypes "
                        "does not report the LINE flag",i);
                }
                break;
            case 3:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_TRIANGLE))
                {
                    ReportError("aiMesh::mFaces[%i] is a TRIANGLE but aiMesh::mPrimitiveTypes "
                        "does not report the TRIANGLE flag",i);
                }
                break;
            default:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_POLYGON))
                {
                    this->ReportError("aiMesh::mFaces[%i] is a POLYGON but aiMesh::mPrimitiveTypes "
                        "does not report the POLYGON flag",i);
                }
                break;
            };
        }

        if (!face.mIndices)
            ReportError("aiMesh::mFaces[%i].mIndices is NULL",i);
    }

    // positions must always be there ...
    if (!pMesh->mNumVertices || (!pMesh->mVertices && !mScene->mFlags)) {
        ReportError("The mesh %s contains no vertices", pMesh->mName.C_Str());
    }

    if (pMesh->mNumVertices > AI_MAX_VERTICES) {
        ReportError("Mesh has too many vertices: %u, but the limit is %u",pMesh->mNumVertices,AI_MAX_VERTICES);
    }
    if (pMesh->mNumFaces > AI_MAX_FACES) {
        ReportError("Mesh has too many faces: %u, but the limit is %u",pMesh->mNumFaces,AI_MAX_FACES);
    }

    // if tangents are there there must also be bitangent vectors ...
    if ((pMesh->mTangents != NULL) != (pMesh->mBitangents != NULL)) {
        ReportError("If there are tangents, bitangent vectors must be present as well");
    }

    // faces, too
    if (!pMesh->mNumFaces || (!pMesh->mFaces && !mScene->mFlags))   {
        ReportError("Mesh %s contains no faces", pMesh->mName.C_Str());
    }

    // now check whether the face indexing layout is correct:
    // unique vertices, pseudo-indexed.
    std::vector<bool> abRefList;
    abRefList.resize(pMesh->mNumVertices,false);
    for (unsigned int i = 0; i < pMesh->mNumFaces;++i)
    {
        aiFace& face = pMesh->mFaces[i];
        if (face.mNumIndices > AI_MAX_FACE_INDICES) {
            ReportError("Face %u has too many faces: %u, but the limit is %u",i,face.mNumIndices,AI_MAX_FACE_INDICES);
        }

        for (unsigned int a = 0; a < face.mNumIndices;++a)
        {
            if (face.mIndices[a] >= pMesh->mNumVertices)    {
                ReportError("aiMesh::mFaces[%i]::mIndices[%i] is out of range",i,a);
            }
            // the MSB flag is temporarily used by the extra verbose
            // mode to tell us that the JoinVerticesProcess might have
            // been executed already.
			/*if ( !(this->mScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT ) && !(this->mScene->mFlags & AI_SCENE_FLAGS_ALLOW_SHARED) &&
				abRefList[face.mIndices[a]])
            {
                ReportError("aiMesh::mVertices[%i] is referenced twice - second "
                    "time by aiMesh::mFaces[%i]::mIndices[%i]",face.mIndices[a],i,a);
            }*/
            abRefList[face.mIndices[a]] = true;
        }
    }

    // check whether there are vertices that aren't referenced by a face
    bool b = false;
    for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
        if (!abRefList[i])b = true;
    }
    abRefList.clear();
    if (b) {
    	ReportWarning("There are unreferenced vertices");
    }

    // texture channel 2 may not be set if channel 1 is zero ...
    {
        unsigned int i = 0;
        for (;i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)
        {
            if (!pMesh->HasTextureCoords(i))break;
        }
        for (;i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)
            if (pMesh->HasTextureCoords(i))
            {
                ReportError("Texture coordinate channel %i exists "
                    "although the previous channel was NULL.",i);
            }
    }
    // the same for the vertex colors
    {
        unsigned int i = 0;
        for (;i < AI_MAX_NUMBER_OF_COLOR_SETS;++i)
        {
            if (!pMesh->HasVertexColors(i))break;
        }
        for (;i < AI_MAX_NUMBER_OF_COLOR_SETS;++i)
            if (pMesh->HasVertexColors(i))
            {
                ReportError("Vertex color channel %i is exists "
                    "although the previous channel was NULL.",i);
            }
    }


    // now validate all bones
    if (pMesh->mNumBones)
    {
        if (!pMesh->mBones)
        {
            ReportError("aiMesh::mBones is NULL (aiMesh::mNumBones is %i)",
                pMesh->mNumBones);
        }
        std::unique_ptr<float[]> afSum(nullptr);
        if (pMesh->mNumVertices)
        {
            afSum.reset(new float[pMesh->mNumVertices]);
            for (unsigned int i = 0; i < pMesh->mNumVertices;++i)
                afSum[i] = 0.0f;
        }

        // check whether there are duplicate bone names
        for (unsigned int i = 0; i < pMesh->mNumBones;++i)
        {
            const aiBone* bone = pMesh->mBones[i];
            if (bone->mNumWeights > AI_MAX_BONE_WEIGHTS) {
                ReportError("Bone %u has too many weights: %u, but the limit is %u",i,bone->mNumWeights,AI_MAX_BONE_WEIGHTS);
            }

            if (!pMesh->mBones[i])
            {
                ReportError("aiMesh::mBones[%i] is NULL (aiMesh::mNumBones is %i)",
                    i,pMesh->mNumBones);
            }
            Validate(pMesh,pMesh->mBones[i],afSum.get());

            for (unsigned int a = i+1; a < pMesh->mNumBones;++a)
            {
                if (pMesh->mBones[i]->mName == pMesh->mBones[a]->mName)
                {
                    const char *name = "unknown";
                    if (nullptr != pMesh->mBones[ i ]->mName.C_Str()) {
                        name = pMesh->mBones[ i ]->mName.C_Str();
                    }
                    ReportError("aiMesh::mBones[%i], name = \"%s\" has the same name as "
                        "aiMesh::mBones[%i]", i, name, a );
                }
            }
        }
        // check whether all bone weights for a vertex sum to 1.0 ...
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)
        {
            if (afSum[i] && (afSum[i] <= 0.94 || afSum[i] >= 1.05)) {
                ReportWarning("aiMesh::mVertices[%i]: bone weight sum != 1.0 (sum is %f)",i,afSum[i]);
            }
        }
    }
    else if (pMesh->mBones)
    {
        ReportError("aiMesh::mBones is non-null although there are no bones");
    }
}